

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_39d9d1::Handlers::beginEncrypt(Handlers *this,JSON *j)

{
  undefined8 extraout_RAX;
  char *pcVar1;
  bool owner_password_seen;
  bool user_password_seen;
  allocator<char> local_9d;
  int key_len;
  undefined1 local_98 [32];
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  local_78;
  string owner_password;
  string user_password;
  
  key_len = 0;
  user_password._M_dataplus._M_p = (pointer)&user_password.field_2;
  user_password._M_string_length = 0;
  owner_password._M_dataplus._M_p = (pointer)&owner_password.field_2;
  owner_password._M_string_length = 0;
  user_password.field_2._M_local_buf[0] = '\0';
  owner_password.field_2._M_local_buf[0] = '\0';
  user_password_seen = false;
  owner_password_seen = false;
  local_78.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_78.super__Function_base._M_functor._8_8_ = 0;
  local_78.super__Function_base._M_manager = (_Manager_type)0x0;
  local_78._M_invoker = (_Invoker_type)0x0;
  local_78.super__Function_base._M_functor._M_unused._M_object = operator_new(0x30);
  *(int **)local_78.super__Function_base._M_functor._M_unused._0_8_ = &key_len;
  *(Handlers **)((long)local_78.super__Function_base._M_functor._M_unused._0_8_ + 8) = this;
  *(bool **)((long)local_78.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &user_password_seen;
  *(string **)((long)local_78.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       &user_password;
  *(bool **)((long)local_78.super__Function_base._M_functor._M_unused._0_8_ + 0x20) =
       &owner_password_seen;
  *(string **)((long)local_78.super__Function_base._M_functor._M_unused._0_8_ + 0x28) =
       &owner_password;
  local_78._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:283:23)>
       ::_M_invoke;
  local_78.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:283:23)>
       ::_M_manager;
  JSON::forEachDictItem(j,&local_78);
  std::_Function_base::~_Function_base(&local_78.super__Function_base);
  if (key_len != 0) {
    if ((user_password_seen == true) && (owner_password_seen != false)) {
      QPDFJob::Config::encrypt
                ((Config *)local_98,
                 (char *)(this->c_main).
                         super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 key_len);
      std::__shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2> *)local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      std::__cxx11::string::~string((string *)&owner_password);
      std::__cxx11::string::~string((string *)&user_password);
      return;
    }
    pcVar1 = 
    "the user and owner password are both required; use the empty string for the user password if you don\'t want a password"
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,
               "the user and owner password are both required; use the empty string for the user password if you don\'t want a password"
               ,&local_9d);
    usage((Handlers *)local_98,(string *)pcVar1);
  }
  pcVar1 = 
  "exactly one of 40bit, 128bit, or 256bit must be given; an empty dictionary may be supplied for one of them to set the key length without imposing any restrictions"
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,
             "exactly one of 40bit, 128bit, or 256bit must be given; an empty dictionary may be supplied for one of them to set the key length without imposing any restrictions"
             ,&local_9d);
  usage((Handlers *)local_98,(string *)pcVar1);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&owner_password);
  std::__cxx11::string::~string((string *)&user_password);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
Handlers::beginEncrypt(JSON j)
{
    // This method is only called if the overall JSON structure matches the schema, so we already
    // know that keys that are present have the right types.
    int key_len = 0;
    std::string user_password;
    std::string owner_password;
    bool user_password_seen = false;
    bool owner_password_seen = false;
    j.forEachDictItem([&](std::string const& key, JSON value) {
        if ((key == "40bit") || (key == "128bit") || (key == "256bit")) {
            if (key_len != 0) {
                QTC::TC("qpdf", "QPDFJob json encrypt duplicate key length");
                usage("exactly one of 40bit, 128bit, or 256bit must be given");
            }
            key_len = QUtil::string_to_int(key.c_str());
        } else if (key == "userPassword") {
            user_password_seen = value.getString(user_password);
        } else if (key == "ownerPassword") {
            owner_password_seen = value.getString(owner_password);
        }
    });
    if (key_len == 0) {
        QTC::TC("qpdf", "QPDFJob json encrypt no key length");
        usage(
            "exactly one of 40bit, 128bit, or 256bit must be given; an empty dictionary may be "
            "supplied for one of them to set the key length without imposing any restrictions");
    }
    if (!(user_password_seen && owner_password_seen)) {
        QTC::TC("qpdf", "QPDFJob json encrypt missing password");
        usage(
            "the user and owner password are both required; use the empty string for the user "
            "password if you don't want a password");
    }
    this->c_enc = c_main->encrypt(key_len, user_password, owner_password);
}